

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::~JUnitTestOutput(JUnitTestOutput *this)

{
  JUnitTestOutputImpl *mem;
  
  (this->super_TestOutput)._vptr_TestOutput = (_func_int **)&PTR__JUnitTestOutput_00164590;
  resetTestGroupResult(this);
  mem = this->impl_;
  if (mem != (JUnitTestOutputImpl *)0x0) {
    SimpleString::~SimpleString(&mem->stdOutput_);
    SimpleString::~SimpleString(&mem->package_);
    SimpleString::~SimpleString(&(mem->results_).group_);
    operator_delete(mem,0x70);
  }
  TestOutput::~TestOutput(&this->super_TestOutput);
  return;
}

Assistant:

JUnitTestOutput::~JUnitTestOutput()
{
    resetTestGroupResult();
    delete impl_;
}